

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<unsigned_char,_unsigned_int,_2>::
     AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (uchar *lhs,uint *rhs,uchar *result)

{
  byte bVar1;
  uint uVar2;
  undefined1 *in_RDX;
  int *in_RSI;
  byte *in_RDI;
  uint32_t tmp;
  
  uVar2 = (uint)*in_RDI + *in_RSI;
  if (*in_RDI <= uVar2) {
    bVar1 = std::numeric_limits<unsigned_char>::max();
    if (uVar2 <= bVar1) {
      *in_RDX = (char)uVar2;
      return;
    }
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        //32-bit or less - both are unsigned
        std::uint32_t tmp = (std::uint32_t)lhs + (std::uint32_t)rhs;

        // We added and it didn't get smaller or exceed maxInt
        if( tmp >= lhs && tmp <= std::numeric_limits<T>::max() )
        {
            result = (T)tmp;
            return;
        }
        E::SafeIntOnOverflow();
    }